

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

String * Lexer::DescribeTokenPrivate(String *__return_storage_ptr__,Token tokType,TokenInfo *tok)

{
  undefined1 *puVar1;
  pointer pcVar2;
  String *pSVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  char *pcVar5;
  char *pcVar6;
  String local_80;
  String local_60;
  String local_40;
  
  if ((int)tokType < 0x49) {
    LexerScanner::GetTokenString(LeftShiftAssign);
    paVar4 = &local_80._string.field_2;
    local_80._string._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"\"","");
    String::operator+(&local_60,&local_80,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._string._M_dataplus._M_p != paVar4) {
      operator_delete(local_80._string._M_dataplus._M_p);
    }
    String::operator+(__return_storage_ptr__,&local_60,"\"");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._string._M_dataplus._M_p != &local_60._string.field_2) {
      operator_delete(local_60._string._M_dataplus._M_p);
    }
    pSVar3 = &local_40;
LAB_0011ef35:
    paVar4 = &(pSVar3->_string).field_2;
    puVar1 = *(undefined1 **)(paVar4->_M_local_buf + -0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar1 == paVar4) {
      return __return_storage_ptr__;
    }
    operator_delete(puVar1);
    return __return_storage_ptr__;
  }
  switch(tokType) {
  case Symbol:
    if (tok != (TokenInfo *)0x0) {
LAB_0011f01e:
      (__return_storage_ptr__->_string)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->_string).field_2;
      pcVar2 = (tok->text)._string._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar2,
                 pcVar2 + (tok->text)._string._M_string_length);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_string)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_string).field_2;
    pcVar6 = "a symbol";
    pcVar5 = "";
    break;
  case Number:
    if (tok != (TokenInfo *)0x0) goto LAB_0011f01e;
    (__return_storage_ptr__->_string)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_string).field_2;
    pcVar6 = "a number";
    pcVar5 = "";
    break;
  case String:
    if (tok != (TokenInfo *)0x0) {
      paVar4 = &local_80._string.field_2;
      local_80._string._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"\"","");
      String::operator+(&local_60,&local_80,&tok->text);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._string._M_dataplus._M_p != paVar4) {
        operator_delete(local_80._string._M_dataplus._M_p);
      }
      String::operator+(__return_storage_ptr__,&local_60,"\"");
      pSVar3 = &local_60;
      goto LAB_0011ef35;
    }
    (__return_storage_ptr__->_string)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_string).field_2;
    pcVar6 = "a string";
    pcVar5 = "";
    break;
  case Any:
    if (tok != (TokenInfo *)0x0) goto LAB_0011f01e;
    (__return_storage_ptr__->_string)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_string).field_2;
    pcVar6 = "any token";
    pcVar5 = "";
    break;
  default:
    (__return_storage_ptr__->_string)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_string).field_2;
    pcVar5 = "";
    pcVar6 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar6,pcVar5);
  return __return_storage_ptr__;
}

Assistant:

String Lexer::DescribeTokenPrivate (Token tokType, Lexer::TokenInfo* tok)
{
	if (tokType < LastNamedToken)
		return "\"" + LexerScanner::GetTokenString (tokType) + "\"";

	switch (tokType)
	{
		case Token::Symbol:	return tok ? tok->text : "a symbol";
		case Token::Number:	return tok ? tok->text : "a number";
		case Token::String:	return tok ? ("\"" + tok->text + "\"") : "a string";
		case Token::Any:	return tok ? tok->text : "any token";
		default: break;
	}

	return "";
}